

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testBatchedMatMulDynamicQuantizationConversionParameterValidation(void)

{
  int iVar1;
  ConvolutionLayerParams *pCVar2;
  long lVar3;
  string *psVar4;
  bool bVar5;
  TypeUnion TVar6;
  ModelDescription *pMVar7;
  Type *pTVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  Type *this;
  BatchedMatMulLayerParams *this_00;
  WeightParams *pWVar11;
  QuantizationParams *pQVar12;
  LinearQuantizationParams *pLVar13;
  ostream *poVar14;
  LookUpTableQuantizationParams *this_01;
  int iVar15;
  Result res;
  Model m1;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  Model local_60;
  
  CoreML::Specification::Model::Model(&local_60);
  if (local_60._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_60);
    local_60._oneof_case_[0] = 500;
    TVar6.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar6.neuralnetwork_);
    local_60.Type_.pipelineclassifier_ = TVar6.pipelineclassifier_;
  }
  TVar6 = local_60.Type_;
  (local_60.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  if (local_60.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_60.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_60.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  iVar15 = (pAVar10->shape_).total_size_;
  if ((pAVar10->shape_).current_size_ == iVar15) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar15 + 1);
  }
  iVar15 = (pAVar10->shape_).current_size_;
  (pAVar10->shape_).current_size_ = iVar15 + 1;
  ((pAVar10->shape_).rep_)->elements[iVar15] = 1;
  if (local_60.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_60.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_60.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   ((RepeatedPtrFieldBase *)&(TVar6.pipeline_)->models_,(Type *)0x0);
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"batched_mat_mul","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"B");
  if (this->_oneof_case_[0] != 0x415) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this);
    this->_oneof_case_[0] = 0x415;
    this_00 = (BatchedMatMulLayerParams *)operator_new(0x38);
    CoreML::Specification::BatchedMatMulLayerParams::BatchedMatMulLayerParams(this_00);
    (this->layer_).batchedmatmul_ = this_00;
  }
  pCVar2 = (this->layer_).convolution_;
  *(undefined8 *)&pCVar2->_kernelsize_cached_byte_size_ = 4;
  (pCVar2->stride_).current_size_ = 2;
  (pCVar2->stride_).total_size_ = 0;
  *(undefined2 *)((long)&(pCVar2->stride_).rep_ + 2) = 0x100;
  lVar3._0_4_ = (pCVar2->kernelsize_).current_size_;
  lVar3._4_4_ = (pCVar2->kernelsize_).total_size_;
  if (lVar3 == 0) {
    pWVar11 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar11);
    *(WeightParams **)&pCVar2->kernelsize_ = pWVar11;
  }
  pWVar11 = *(WeightParams **)&pCVar2->kernelsize_;
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"11111111","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pWVar11->int8rawvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  if (pWVar11->quantization_ == (QuantizationParams *)0x0) {
    pQVar12 = (QuantizationParams *)operator_new(0x28);
    CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
    pWVar11->quantization_ = pQVar12;
  }
  pQVar12 = pWVar11->quantization_;
  pQVar12->numberofbits_ = 8;
  if (pQVar12 == (QuantizationParams *)0x0) {
    pQVar12 = (QuantizationParams *)operator_new(0x28);
    CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
    pWVar11->quantization_ = pQVar12;
  }
  pQVar12 = pWVar11->quantization_;
  if (pQVar12->_oneof_case_[0] != 0x65) {
    CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar12);
    pQVar12->_oneof_case_[0] = 0x65;
    pLVar13 = (LinearQuantizationParams *)operator_new(0x40);
    CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar13);
    (pQVar12->QuantizationType_).linearquantization_ = pLVar13;
  }
  pLVar13 = (pQVar12->QuantizationType_).linearquantization_;
  iVar15 = (pLVar13->scale_).total_size_;
  if ((pLVar13->scale_).current_size_ == iVar15) {
    google::protobuf::RepeatedField<float>::Reserve(&pLVar13->scale_,iVar15 + 1);
  }
  iVar15 = (pLVar13->scale_).current_size_;
  (pLVar13->scale_).current_size_ = iVar15 + 1;
  ((pLVar13->scale_).rep_)->elements[iVar15] = 4.0;
  CoreML::validate<(MLModelType)500>((Result *)local_b0,&local_60);
  bVar5 = CoreML::Result::good((Result *)local_b0);
  if (bVar5) {
    *(undefined1 *)((long)&(pCVar2->stride_).rep_ + 2) = 1;
    CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
    local_b0 = local_88;
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
    if (local_80._M_p != local_78 + 8) {
      operator_delete(local_80._M_p,local_78._8_8_ + 1);
    }
    bVar5 = CoreML::Result::good((Result *)local_b0);
    if (bVar5) {
      *(undefined1 *)((long)&(pCVar2->stride_).rep_ + 2) = 0;
      if (pWVar11->quantization_ == (QuantizationParams *)0x0) {
        pQVar12 = (QuantizationParams *)operator_new(0x28);
        CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
        pWVar11->quantization_ = pQVar12;
      }
      pQVar12 = pWVar11->quantization_;
      if (pQVar12->_oneof_case_[0] != 0x65) {
        CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar12);
        pQVar12->_oneof_case_[0] = 0x65;
        pLVar13 = (LinearQuantizationParams *)operator_new(0x40);
        CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar13);
        (pQVar12->QuantizationType_).linearquantization_ = pLVar13;
      }
      pLVar13 = (pQVar12->QuantizationType_).linearquantization_;
      iVar15 = (pLVar13->bias_).total_size_;
      if ((pLVar13->bias_).current_size_ == iVar15) {
        google::protobuf::RepeatedField<float>::Reserve(&pLVar13->bias_,iVar15 + 1);
      }
      iVar15 = (pLVar13->bias_).current_size_;
      (pLVar13->bias_).current_size_ = iVar15 + 1;
      ((pLVar13->bias_).rep_)->elements[iVar15] = 0.0;
      CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
      local_b0 = local_88;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
      if (local_80._M_p != local_78 + 8) {
        operator_delete(local_80._M_p,local_78._8_8_ + 1);
      }
      bVar5 = CoreML::Result::good((Result *)local_b0);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x70);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2d7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      }
      else {
        if (pWVar11->quantization_ == (QuantizationParams *)0x0) {
          pQVar12 = (QuantizationParams *)operator_new(0x28);
          CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
          pWVar11->quantization_ = pQVar12;
        }
        pQVar12 = pWVar11->quantization_;
        if (pQVar12->_oneof_case_[0] != 0x65) {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar12);
          pQVar12->_oneof_case_[0] = 0x65;
          pLVar13 = (LinearQuantizationParams *)operator_new(0x40);
          CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar13);
          (pQVar12->QuantizationType_).linearquantization_ = pLVar13;
        }
        (((pQVar12->QuantizationType_).linearquantization_)->bias_).current_size_ = 0;
        if (pWVar11->quantization_ == (QuantizationParams *)0x0) {
          pQVar12 = (QuantizationParams *)operator_new(0x28);
          CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
          pWVar11->quantization_ = pQVar12;
        }
        pWVar11->quantization_->numberofbits_ = 7;
        CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
        local_b0 = local_88;
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
        if (local_80._M_p != local_78 + 8) {
          operator_delete(local_80._M_p,local_78._8_8_ + 1);
        }
        bVar5 = CoreML::Result::good((Result *)local_b0);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2dd);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        }
        else {
          if (pWVar11->quantization_ == (QuantizationParams *)0x0) {
            pQVar12 = (QuantizationParams *)operator_new(0x28);
            CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
            pWVar11->quantization_ = pQVar12;
          }
          pQVar12 = pWVar11->quantization_;
          pQVar12->numberofbits_ = 8;
          if (pQVar12 == (QuantizationParams *)0x0) {
            pQVar12 = (QuantizationParams *)operator_new(0x28);
            CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
            pWVar11->quantization_ = pQVar12;
          }
          pQVar12 = pWVar11->quantization_;
          if (pQVar12->_oneof_case_[0] != 0x66) {
            CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar12);
            pQVar12->_oneof_case_[0] = 0x66;
            this_01 = (LookUpTableQuantizationParams *)operator_new(0x28);
            CoreML::Specification::LookUpTableQuantizationParams::LookUpTableQuantizationParams
                      (this_01);
            (pQVar12->QuantizationType_).lookuptablequantization_ = this_01;
          }
          pLVar13 = (pQVar12->QuantizationType_).linearquantization_;
          iVar15 = (pLVar13->scale_).total_size_;
          if ((pLVar13->scale_).current_size_ == iVar15) {
            google::protobuf::RepeatedField<float>::Reserve(&pLVar13->scale_,iVar15 + 1);
          }
          iVar15 = (pLVar13->scale_).current_size_;
          (pLVar13->scale_).current_size_ = iVar15 + 1;
          ((pLVar13->scale_).rep_)->elements[iVar15] = 1.0;
          CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
          local_b0 = local_88;
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
          if (local_80._M_p != local_78 + 8) {
            operator_delete(local_80._M_p,local_78._8_8_ + 1);
          }
          bVar5 = CoreML::Result::good((Result *)local_b0);
          if (!bVar5) {
            if (pWVar11->quantization_ == (QuantizationParams *)0x0) {
              pQVar12 = (QuantizationParams *)operator_new(0x28);
              CoreML::Specification::QuantizationParams::QuantizationParams(pQVar12);
              pWVar11->quantization_ = pQVar12;
            }
            pQVar12 = pWVar11->quantization_;
            if (pQVar12->_oneof_case_[0] != 0x65) {
              CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar12);
              pQVar12->_oneof_case_[0] = 0x65;
              pLVar13 = (LinearQuantizationParams *)operator_new(0x40);
              CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar13);
              (pQVar12->QuantizationType_).linearquantization_ = pLVar13;
            }
            pLVar13 = (pQVar12->QuantizationType_).linearquantization_;
            iVar15 = (pLVar13->scale_).total_size_;
            if ((pLVar13->scale_).current_size_ == iVar15) {
              google::protobuf::RepeatedField<float>::Reserve(&pLVar13->scale_,iVar15 + 1);
            }
            iVar15 = (pLVar13->scale_).current_size_;
            (pLVar13->scale_).current_size_ = iVar15 + 1;
            ((pLVar13->scale_).rep_)->elements[iVar15] = 4.0;
            psVar4 = (pWVar11->int8rawvalue_).ptr_;
            if (psVar4 != (string *)
                          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              psVar4->_M_string_length = 0;
              *(psVar4->_M_dataplus)._M_p = '\0';
            }
            local_88 = (undefined1  [8])local_78;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"11111111","");
            google::protobuf::internal::ArenaStringPtr::SetNoArena
                      (&pWVar11->rawvalue_,
                       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                       (string *)local_88);
            if (local_88 != (undefined1  [8])local_78) {
              operator_delete((void *)local_88,local_78._0_8_ + 1);
            }
            CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
            local_b0 = local_88;
            std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
            if (local_80._M_p != local_78 + 8) {
              operator_delete(local_80._M_p,local_78._8_8_ + 1);
            }
            bVar5 = CoreML::Result::good((Result *)local_b0);
            if (bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2ea);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," was false, expected true.",0x1a);
            }
            else {
              psVar4 = (pWVar11->rawvalue_).ptr_;
              if (psVar4 != (string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                psVar4->_M_string_length = 0;
                *(psVar4->_M_dataplus)._M_p = '\0';
              }
              CoreML::Specification::WeightParams::set_float16value(pWVar11,"0101010101010101");
              CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
              local_b0 = local_88;
              std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
              if (local_80._M_p != local_78 + 8) {
                operator_delete(local_80._M_p,local_78._8_8_ + 1);
              }
              bVar5 = CoreML::Result::good((Result *)local_b0);
              if (bVar5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x70);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," was false, expected true.",0x1a);
              }
              else {
                psVar4 = (pWVar11->float16value_).ptr_;
                if (psVar4 != (string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                  psVar4->_M_string_length = 0;
                  *(psVar4->_M_dataplus)._M_p = '\0';
                }
                iVar15 = 8;
                do {
                  iVar1 = (pWVar11->floatvalue_).total_size_;
                  if ((pWVar11->floatvalue_).current_size_ == iVar1) {
                    google::protobuf::RepeatedField<float>::Reserve(&pWVar11->floatvalue_,iVar1 + 1)
                    ;
                  }
                  iVar1 = (pWVar11->floatvalue_).current_size_;
                  (pWVar11->floatvalue_).current_size_ = iVar1 + 1;
                  ((pWVar11->floatvalue_).rep_)->elements[iVar1] = 1.0;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
                CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
                local_b0 = local_88;
                std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
                if (local_80._M_p != local_78 + 8) {
                  operator_delete(local_80._M_p,local_78._8_8_ + 1);
                }
                bVar5 = CoreML::Result::good((Result *)local_b0);
                if (!bVar5) {
                  (pWVar11->floatvalue_).current_size_ = 0;
                  iVar15 = 0;
                  goto LAB_0017551f;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x70);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2f8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," was false, expected true.",0x1a);
              }
            }
            iVar15 = 1;
            std::endl<char,std::char_traits<char>>(poVar14);
            goto LAB_0017551f;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2e3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2d1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2cc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  std::ostream::put((char)poVar14);
  iVar15 = 1;
  std::ostream::flush();
LAB_0017551f:
  if (local_a8._M_p != local_a0 + 8) {
    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_60);
  return iVar15;
}

Assistant:

int testBatchedMatMulDynamicQuantizationConversionParameterValidation() {

    Specification::Model m1;
    Specification::NeuralNetwork* nnMain = m1.mutable_neuralnetwork();
    // Required for spec v4 and onwards
    nnMain->set_arrayinputshapemapping(Specification::EXACT_ARRAY_MAPPING);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetworkLayer* layer1 = nnMain->add_layers();
    layer1->set_name("batched_mat_mul");
    layer1->add_input("A");
    layer1->add_output("B");
    Specification::BatchedMatMulLayerParams* batch_mat_mul_params = layer1->mutable_batchedmatmul();
    batch_mat_mul_params->set_weightmatrixfirstdimension(4);
    batch_mat_mul_params->set_weightmatrixseconddimension(2);
    batch_mat_mul_params->set_hasbias(false);
    batch_mat_mul_params->set_int8dynamicquantize(true);

    auto* weights = batch_mat_mul_params->mutable_weights();
    weights->set_int8rawvalue("11111111");
    weights->mutable_quantization()->set_numberofbits(8);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Setup: Correct validation
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Case 1: has bias
    batch_mat_mul_params->set_hasbias(true);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    batch_mat_mul_params->set_hasbias(false);

    // Case 2: Non empty linear quantization bias
    weights->mutable_quantization()->mutable_linearquantization()->add_bias(0);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->clear_bias();

    // Case 3: numberofbits != 8
    weights->mutable_quantization()->set_numberofbits(7);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->set_numberofbits(8);

    // Case 4: Lookup table mode is on
    weights->mutable_quantization()->mutable_lookuptablequantization()->add_floatvalue(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Case 5: uint8 weights
    weights->clear_int8rawvalue();
    weights->set_rawvalue("11111111");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_rawvalue();

    // Case 6: float16 weights
    weights->set_float16value("0101010101010101");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_float16value();

    // Case 7: float weights
    for (int i = 0; i < 8; ++i){
        weights->add_floatvalue(1);
    }
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_floatvalue();

    return 0;
}